

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

bool findInBlock(QTextBlock *block,QString *expression,int offset,FindFlags options,
                QTextCursor *cursor)

{
  ushort uVar1;
  char16_t cVar2;
  QTextDocumentPrivate *p;
  QSharedDataPointer<QTextCursorPrivate> QVar3;
  char cVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  int start;
  long in_FS_OFFSET;
  QTextCursor local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text(&local_58,block);
  QString::replace((QChar)(char16_t)&local_58,(QChar)0xa0,0x20);
  if (-1 < offset) {
    do {
      if ((ulong)local_58.d.size < (undefined1 *)(ulong)(uint)offset) break;
      if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                 super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) == 0) {
        uVar5 = QString::indexOf((QString *)&local_58,(longlong)expression,offset);
      }
      else {
        uVar5 = QString::lastIndexOf((QString *)&local_58,(longlong)expression,offset);
      }
      if (uVar5 == 0xffffffff) break;
      if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                 super_QFlagsStorage<QTextDocument::FindFlag>.i & 4) == 0) {
LAB_004c1ad8:
        p = block->p;
        iVar7 = QTextBlock::position(block);
        QTextCursor::QTextCursor(&local_60,p,uVar5 + iVar7);
        QVar3.d.ptr = (totally_ordered_wrapper<QTextCursorPrivate_*>)(cursor->d).d.ptr;
        (cursor->d).d.ptr = (QTextCursorPrivate *)local_60;
        local_60.d.d.ptr =
             (QSharedDataPointer<QTextCursorPrivate>)
             (QSharedDataPointer<QTextCursorPrivate>)QVar3.d.ptr;
        QTextCursor::~QTextCursor(&local_60);
        iVar7 = QTextCursor::position(cursor);
        QTextCursor::setPosition(cursor,iVar7 + (int)(expression->d).size,KeepAnchor);
        bVar6 = true;
        goto LAB_004c1b2f;
      }
      iVar7 = (int)(expression->d).size + uVar5;
      if (uVar5 == 0) {
LAB_004c1a7d:
        if ((undefined1 *)(long)iVar7 != (undefined1 *)local_58.d.size) {
          cVar2 = local_58.d.ptr[iVar7];
          if (((ushort)cVar2 - 0x30 < 10) ||
             ((ushort)cVar2 - 0x41 < 0x3a && (ushort)cVar2 - 0x61 < 0xfffffffa)) goto LAB_004c1abf;
          if (0x7f < (ushort)cVar2) {
            cVar4 = QChar::isLetterOrNumber_helper((uint)(ushort)cVar2);
            if (cVar4 != '\0') goto LAB_004c1abf;
          }
        }
        goto LAB_004c1ad8;
      }
      uVar1 = *(ushort *)
               ((long)local_58.d.ptr + ((long)(((ulong)uVar5 << 0x20) + -0x100000000) >> 0x1f));
      if ((9 < uVar1 - 0x30) && (0x39 < uVar1 - 0x41 || 0xfffffff9 < uVar1 - 0x61)) {
        if (0x7f < uVar1) {
          cVar4 = QChar::isLetterOrNumber_helper((uint)uVar1);
          if (cVar4 != '\0') goto LAB_004c1abf;
        }
        goto LAB_004c1a7d;
      }
LAB_004c1abf:
      offset = iVar7 + CaseSensitive;
      if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                 super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) != 0) {
        offset = uVar5 - CaseSensitive;
      }
    } while (-1 < offset);
  }
  bVar6 = false;
LAB_004c1b2f:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QString &expression, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    Qt::CaseSensitivity sensitivity = options & QTextDocument::FindCaseSensitively ? Qt::CaseSensitive : Qt::CaseInsensitive;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expression, offset, sensitivity) : text.indexOf(expression, offset, sensitivity);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + expression.size();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + expression.size(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}